

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuslistener.cpp
# Opt level: O0

void __thiscall QDBusListener::loadJson(QDBusListener *this,QString *fileName)

{
  QLatin1StringView t;
  QLatin1StringView t_00;
  QLatin1StringView key_00;
  QLatin1StringView t_01;
  QLatin1StringView key_01;
  QLatin1StringView t_02;
  QLatin1StringView t_03;
  QLatin1StringView t_04;
  QLatin1StringView t_05;
  QLatin1StringView t_06;
  QLatin1StringView t_07;
  QLatin1StringView key_02;
  QLatin1StringView key_03;
  QLatin1StringView key_04;
  QLatin1StringView key_05;
  bool bVar1;
  Provider p;
  Setting s;
  ulong uVar2;
  qsizetype qVar3;
  bool *pbVar4;
  size_type sVar5;
  QString *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int val_1;
  Setting setting;
  int val;
  Provider provider;
  QString *settingString;
  QString *providerString;
  QString *key;
  QString *location;
  QJsonObject *obj;
  QJsonArray *sigs;
  QJsonObject *root;
  DBusKey dkey;
  bool success_1;
  bool success;
  const_iterator sig;
  QJsonDocument doc;
  QJsonParseError error;
  QFile file;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_16;
  QLoggingCategoryMacroHolder<(QtMsgType)4> qt_category_15;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_14;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_13;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_12;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_11;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_10;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_9;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_8;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_7;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_6;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_5;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_fffffffffffff748;
  OpenModeFlag in_stack_fffffffffffff74c;
  DBusKey *in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff758;
  Setting in_stack_fffffffffffff75c;
  DBusKey *in_stack_fffffffffffff760;
  DBusKey *in_stack_fffffffffffff768;
  DBusKey *in_stack_fffffffffffff770;
  DBusKey *in_stack_fffffffffffff778;
  DBusKey *pDVar6;
  QDebug *in_stack_fffffffffffff798;
  QDebug local_600 [5];
  QDebug local_5d8;
  ChangeSignal local_5d0 [5];
  QDebug local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  QDebug local_550 [4];
  QMetaEnum local_530;
  byte local_519;
  QDebug local_4f8 [4];
  QMetaEnum local_4d8;
  byte local_4c1;
  QDebug local_440 [5];
  QDebug local_418 [5];
  QDebug local_3f0 [5];
  QDebug local_3c8;
  DBusKey local_3c0;
  QJsonValueConstRef local_390;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 local_380;
  undefined1 *local_378;
  QDebug local_350;
  QJsonArray local_348 [40];
  QDebug local_320 [5];
  QDebug local_2f8;
  QJsonObject local_2f0 [40];
  QDebug local_2c8 [8];
  QDebug local_288;
  undefined1 local_280 [24];
  undefined1 *local_268;
  QJsonParseError local_260 [5];
  QDebug local_238 [6];
  QDebug local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  QJsonValue local_188 [24];
  QJsonValue local_170 [24];
  QJsonValue local_158 [24];
  QJsonValue local_140 [24];
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  QJsonValue local_c8 [24];
  QJsonValue local_b0 [24];
  undefined1 *local_98;
  undefined1 *local_90;
  QJsonValue local_88 [24];
  QJsonValue local_70 [24];
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_200 = &DAT_aaaaaaaaaaaaaaaa;
  local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_200,in_RSI);
  uVar2 = QFile::exists();
  if ((uVar2 & 1) == 0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcQpaThemeDBus();
    anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffff750,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb2360a);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffff760,
                 (char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                 (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                 (char *)0xb23623);
      QMessageLogger::warning();
      QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                         (QString *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                         (QString *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
      QDebug::~QDebug(&local_208);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
  }
  else {
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffff750,
               in_stack_fffffffffffff74c);
    uVar2 = QFile::open((QFlags_conflict *)&local_200);
    if ((uVar2 & 1) == 0) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      lcQpaThemeDBus();
      anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffff750,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb23729);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffff760,
                   (char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                   (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                   (char *)0xb23742);
        QMessageLogger::warning();
        QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                           (QString *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758))
        ;
        QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
        QDebug::~QDebug(local_238);
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
    }
    else {
      local_260[0] = (QJsonParseError)&DAT_aaaaaaaaaaaaaaaa;
      QJsonParseError::QJsonParseError(local_260);
      local_268 = &DAT_aaaaaaaaaaaaaaaa;
      QIODevice::readAll();
      QJsonDocument::fromJson((QByteArray *)&local_268,(QJsonParseError *)local_280);
      QByteArray::~QByteArray((QByteArray *)0xb2381e);
      if (local_260[0].error == NoError) {
        uVar2 = QJsonDocument::isObject();
        if ((uVar2 & 1) == 0) {
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          lcQpaThemeDBus();
          anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffff750,
                     (QLoggingCategory *)
                     CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_48), bVar1) {
            anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb239a8);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffff760,
                       (char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                       (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                       (char *)0xb239c1);
            QMessageLogger::warning();
            QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
            QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798
                              );
            anon_unknown.dwarf_1f37634::JsonKeys::root();
            t.m_data = (char *)in_stack_fffffffffffff778;
            t.m_size = (qsizetype)in_stack_fffffffffffff770;
            QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,t);
            QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798
                              );
            QDebug::~QDebug(local_2c8);
            local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffffff00);
          }
        }
        else {
          QJsonDocument::object();
          anon_unknown.dwarf_1f37634::JsonKeys::root();
          uVar2 = QJsonObject::contains((QLatin1String *)local_2f0);
          if ((uVar2 & 1) == 0) {
            local_58 = &DAT_aaaaaaaaaaaaaaaa;
            local_50 = &DAT_aaaaaaaaaaaaaaaa;
            lcQpaThemeDBus();
            anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
            QLoggingCategoryMacroHolder
                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffff750,
                       (QLoggingCategory *)
                       CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
            while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                     ((QLoggingCategoryMacroHolder *)&local_58), bVar1) {
              anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb23b44);
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)in_stack_fffffffffffff760,
                         (char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                         (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                         (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                         (char *)0xb23b5d);
              QMessageLogger::warning();
              QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
              QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                 (char *)in_stack_fffffffffffff798);
              anon_unknown.dwarf_1f37634::JsonKeys::root();
              t_00.m_data = (char *)in_stack_fffffffffffff778;
              t_00.m_size = (qsizetype)in_stack_fffffffffffff770;
              QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,t_00);
              QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                 (char *)in_stack_fffffffffffff798);
              QDebug::~QDebug(&local_2f8);
              local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
            }
          }
          else {
            anon_unknown.dwarf_1f37634::JsonKeys::root();
            key_00.m_data = (char *)in_stack_fffffffffffff778;
            key_00.m_size = (qsizetype)in_stack_fffffffffffff770;
            QJsonObject::operator[]((QJsonObject *)in_stack_fffffffffffff750,key_00);
            anon_unknown.dwarf_1f37634::JsonKeys::dbusSignals();
            QJsonValue::operator[]((QLatin1String *)local_70);
            bVar1 = QJsonValue::isArray((QJsonValue *)0xb23c9a);
            QJsonValue::~QJsonValue(local_70);
            QJsonValue::~QJsonValue(local_88);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              anon_unknown.dwarf_1f37634::JsonKeys::root();
              key_01.m_data = (char *)in_stack_fffffffffffff778;
              key_01.m_size = (qsizetype)in_stack_fffffffffffff770;
              QJsonObject::operator[]((QJsonObject *)in_stack_fffffffffffff750,key_01);
              anon_unknown.dwarf_1f37634::JsonKeys::dbusSignals();
              QJsonValue::operator[]((QLatin1String *)local_b0);
              QJsonValue::toArray();
              QJsonValue::~QJsonValue(local_b0);
              QJsonValue::~QJsonValue(local_c8);
              qVar3 = QJsonArray::count((QJsonArray *)0xb23eca);
              if (0 < qVar3) {
                local_378 = &DAT_aaaaaaaaaaaaaaaa;
                local_380 = (anon_union_8_3_4e90986c_for_QJsonValueConstRef_0)&DAT_aaaaaaaaaaaaaaaa;
                _local_380 = (QJsonValueConstRef)
                             QJsonArray::constBegin
                                       ((QJsonArray *)
                                        CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758
                                                ));
LAB_00b2402a:
                local_390 = (QJsonValueConstRef)
                            QJsonArray::constEnd
                                      ((QJsonArray *)
                                       CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758)
                                      );
                bVar1 = ::operator!=((const_iterator *)in_stack_fffffffffffff750,
                                     (const_iterator *)
                                     CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
                if (bVar1) {
                  QJsonArray::const_iterator::operator->((const_iterator *)&local_380);
                  bVar1 = QJsonValueConstRef::isObject((QJsonValueConstRef *)0xb2407a);
                  if (bVar1) {
                    QJsonArray::const_iterator::operator->((const_iterator *)&local_380);
                    QJsonValueConstRef::toObject();
                    pDVar6 = &local_3c0;
                    anon_unknown.dwarf_1f37634::JsonKeys::dbusLocation();
                    uVar2 = QJsonObject::contains((QLatin1String *)pDVar6);
                    if ((uVar2 & 1) == 0) {
                      local_f8 = &DAT_aaaaaaaaaaaaaaaa;
                      local_f0 = &DAT_aaaaaaaaaaaaaaaa;
                      lcQpaThemeDBus();
                      anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                      QLoggingCategoryMacroHolder
                                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                                 in_stack_fffffffffffff750,
                                 (QLoggingCategory *)
                                 CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
                      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                     operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_f8)
                            , bVar1) {
                        anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb24276);
                        QMessageLogger::QMessageLogger
                                  ((QMessageLogger *)in_stack_fffffffffffff760,
                                   (char *)CONCAT44(in_stack_fffffffffffff75c,
                                                    in_stack_fffffffffffff758),
                                   (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                   (char *)CONCAT44(in_stack_fffffffffffff74c,
                                                    in_stack_fffffffffffff748),(char *)0xb2428f);
                        QMessageLogger::warning();
                        QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                           (QString *)
                                           CONCAT44(in_stack_fffffffffffff75c,
                                                    in_stack_fffffffffffff758));
                        QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                           (char *)in_stack_fffffffffffff798);
                        anon_unknown.dwarf_1f37634::JsonKeys::dbusLocation();
                        t_04.m_data = (char *)in_stack_fffffffffffff778;
                        t_04.m_size = (qsizetype)in_stack_fffffffffffff770;
                        QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,t_04);
                        QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                           (char *)in_stack_fffffffffffff798);
                        QDebug::~QDebug(&local_3c8);
                        local_f0 = (undefined1 *)((ulong)local_f0 & 0xffffffffffffff00);
                      }
                      bVar1 = true;
                      pDVar6 = in_stack_fffffffffffff778;
                    }
                    else {
                      anon_unknown.dwarf_1f37634::JsonKeys::dbusKey();
                      uVar2 = QJsonObject::contains((QLatin1String *)pDVar6);
                      if ((uVar2 & 1) == 0) {
                        local_108 = &DAT_aaaaaaaaaaaaaaaa;
                        local_100 = &DAT_aaaaaaaaaaaaaaaa;
                        lcQpaThemeDBus();
                        anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                        QLoggingCategoryMacroHolder
                                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                                   in_stack_fffffffffffff750,
                                   (QLoggingCategory *)
                                   CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
                        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                       operator_cast_to_bool
                                                 ((QLoggingCategoryMacroHolder *)&local_108), bVar1)
                        {
                          anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                          name((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb243cf);
                          QMessageLogger::QMessageLogger
                                    ((QMessageLogger *)in_stack_fffffffffffff760,
                                     (char *)CONCAT44(in_stack_fffffffffffff75c,
                                                      in_stack_fffffffffffff758),
                                     (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                     (char *)CONCAT44(in_stack_fffffffffffff74c,
                                                      in_stack_fffffffffffff748),(char *)0xb243e8);
                          QMessageLogger::warning();
                          QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                             (QString *)
                                             CONCAT44(in_stack_fffffffffffff75c,
                                                      in_stack_fffffffffffff758));
                          QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                             (char *)in_stack_fffffffffffff798);
                          anon_unknown.dwarf_1f37634::JsonKeys::dbusKey();
                          t_05.m_data = (char *)in_stack_fffffffffffff778;
                          t_05.m_size = (qsizetype)in_stack_fffffffffffff770;
                          QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,t_05);
                          QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                             (char *)in_stack_fffffffffffff798);
                          QDebug::~QDebug(local_3f0);
                          local_100 = (undefined1 *)((ulong)local_100 & 0xffffffffffffff00);
                        }
                        bVar1 = true;
                        pDVar6 = in_stack_fffffffffffff778;
                      }
                      else {
                        anon_unknown.dwarf_1f37634::JsonKeys::provider();
                        uVar2 = QJsonObject::contains((QLatin1String *)pDVar6);
                        if ((uVar2 & 1) == 0) {
                          local_118 = &DAT_aaaaaaaaaaaaaaaa;
                          local_110 = &DAT_aaaaaaaaaaaaaaaa;
                          lcQpaThemeDBus();
                          anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                          QLoggingCategoryMacroHolder
                                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                                     in_stack_fffffffffffff750,
                                     (QLoggingCategory *)
                                     CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
                          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                         operator_cast_to_bool
                                                   ((QLoggingCategoryMacroHolder *)&local_118),
                                bVar1) {
                            anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                            name((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb24528);
                            QMessageLogger::QMessageLogger
                                      ((QMessageLogger *)in_stack_fffffffffffff760,
                                       (char *)CONCAT44(in_stack_fffffffffffff75c,
                                                        in_stack_fffffffffffff758),
                                       (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                       (char *)CONCAT44(in_stack_fffffffffffff74c,
                                                        in_stack_fffffffffffff748),(char *)0xb24541)
                            ;
                            QMessageLogger::warning();
                            QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                               (QString *)
                                               CONCAT44(in_stack_fffffffffffff75c,
                                                        in_stack_fffffffffffff758));
                            in_stack_fffffffffffff798 =
                                 QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                                    (char *)in_stack_fffffffffffff798);
                            anon_unknown.dwarf_1f37634::JsonKeys::provider();
                            t_06.m_data = (char *)in_stack_fffffffffffff778;
                            t_06.m_size = (qsizetype)in_stack_fffffffffffff770;
                            QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,t_06);
                            QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                               (char *)in_stack_fffffffffffff798);
                            QDebug::~QDebug(local_418);
                            local_110 = (undefined1 *)((ulong)local_110 & 0xffffffffffffff00);
                          }
                          bVar1 = true;
                          pDVar6 = in_stack_fffffffffffff778;
                        }
                        else {
                          anon_unknown.dwarf_1f37634::JsonKeys::setting();
                          uVar2 = QJsonObject::contains((QLatin1String *)pDVar6);
                          if ((uVar2 & 1) == 0) {
                            local_128 = &DAT_aaaaaaaaaaaaaaaa;
                            local_120 = &DAT_aaaaaaaaaaaaaaaa;
                            lcQpaThemeDBus();
                            anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                            QLoggingCategoryMacroHolder
                                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                                       in_stack_fffffffffffff750,
                                       (QLoggingCategory *)
                                       CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748)
                                      );
                            while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                           operator_cast_to_bool
                                                     ((QLoggingCategoryMacroHolder *)&local_128),
                                  bVar1) {
                              anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>
                              ::name((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb24681);
                              QMessageLogger::QMessageLogger
                                        ((QMessageLogger *)in_stack_fffffffffffff760,
                                         (char *)CONCAT44(in_stack_fffffffffffff75c,
                                                          in_stack_fffffffffffff758),
                                         (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                         (char *)CONCAT44(in_stack_fffffffffffff74c,
                                                          in_stack_fffffffffffff748),
                                         (char *)0xb2469a);
                              QMessageLogger::warning();
                              QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                                 (QString *)
                                                 CONCAT44(in_stack_fffffffffffff75c,
                                                          in_stack_fffffffffffff758));
                              QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                                 (char *)in_stack_fffffffffffff798);
                              anon_unknown.dwarf_1f37634::JsonKeys::setting();
                              t_07.m_data = (char *)in_stack_fffffffffffff778;
                              t_07.m_size = (qsizetype)in_stack_fffffffffffff770;
                              QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,t_07);
                              QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                                 (char *)in_stack_fffffffffffff798);
                              QDebug::~QDebug(local_440);
                              local_120 = (undefined1 *)((ulong)local_120 & 0xffffffffffffff00);
                            }
                            bVar1 = true;
                            pDVar6 = in_stack_fffffffffffff778;
                          }
                          else {
                            in_stack_fffffffffffff760 = pDVar6;
                            anon_unknown.dwarf_1f37634::JsonKeys::dbusLocation();
                            key_02.m_data = (char *)in_stack_fffffffffffff778;
                            key_02.m_size = (qsizetype)in_stack_fffffffffffff770;
                            QJsonObject::operator[]((QJsonObject *)in_stack_fffffffffffff750,key_02)
                            ;
                            QJsonValue::toString();
                            QJsonValue::~QJsonValue(local_140);
                            in_stack_fffffffffffff768 = pDVar6;
                            anon_unknown.dwarf_1f37634::JsonKeys::dbusKey();
                            key_03.m_data = (char *)in_stack_fffffffffffff778;
                            key_03.m_size = (qsizetype)in_stack_fffffffffffff770;
                            QJsonObject::operator[]((QJsonObject *)in_stack_fffffffffffff750,key_03)
                            ;
                            QJsonValue::toString();
                            QJsonValue::~QJsonValue(local_158);
                            in_stack_fffffffffffff770 = pDVar6;
                            anon_unknown.dwarf_1f37634::JsonKeys::provider();
                            key_04.m_data = (char *)in_stack_fffffffffffff778;
                            key_04.m_size = (qsizetype)in_stack_fffffffffffff770;
                            QJsonObject::operator[]((QJsonObject *)in_stack_fffffffffffff750,key_04)
                            ;
                            QJsonValue::toString();
                            QJsonValue::~QJsonValue(local_170);
                            anon_unknown.dwarf_1f37634::JsonKeys::setting();
                            key_05.m_data = (char *)pDVar6;
                            key_05.m_size = (qsizetype)in_stack_fffffffffffff770;
                            QJsonObject::operator[]((QJsonObject *)in_stack_fffffffffffff750,key_05)
                            ;
                            QJsonValue::toString();
                            QJsonValue::~QJsonValue(local_188);
                            local_4c1 = 0xaa;
                            local_4d8 = QMetaEnum::fromType<QDBusListener::Provider>();
                            QString::toLatin1((QString *)
                                              CONCAT44(in_stack_fffffffffffff74c,
                                                       in_stack_fffffffffffff748));
                            pbVar4 = (bool *)QByteArray::operator_cast_to_char_
                                                       ((QByteArray *)0xb249aa);
                            p = QMetaEnum::keyToValue((char *)&local_4d8,pbVar4);
                            QByteArray::~QByteArray((QByteArray *)0xb249d3);
                            if ((local_4c1 & 1) == 0) {
                              local_198 = &DAT_aaaaaaaaaaaaaaaa;
                              local_190 = &DAT_aaaaaaaaaaaaaaaa;
                              lcQpaThemeDBus();
                              anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>
                              ::QLoggingCategoryMacroHolder
                                        ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                                         in_stack_fffffffffffff750,
                                         (QLoggingCategory *)
                                         CONCAT44(in_stack_fffffffffffff74c,
                                                  in_stack_fffffffffffff748));
                              while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                             operator_cast_to_bool
                                                       ((QLoggingCategoryMacroHolder *)&local_198),
                                    bVar1) {
                                anon_unknown.dwarf_1f37634::
                                QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                                          ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb24a42);
                                QMessageLogger::QMessageLogger
                                          ((QMessageLogger *)in_stack_fffffffffffff760,
                                           (char *)CONCAT44(in_stack_fffffffffffff75c,
                                                            in_stack_fffffffffffff758),
                                           (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                           (char *)CONCAT44(in_stack_fffffffffffff74c,
                                                            in_stack_fffffffffffff748),
                                           (char *)0xb24a5b);
                                QMessageLogger::warning();
                                QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                                   (QString *)
                                                   CONCAT44(in_stack_fffffffffffff75c,
                                                            in_stack_fffffffffffff758));
                                QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                                   (char *)in_stack_fffffffffffff798);
                                QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                                   (QString *)
                                                   CONCAT44(in_stack_fffffffffffff75c,
                                                            in_stack_fffffffffffff758));
                                QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                                   (char *)in_stack_fffffffffffff798);
                                QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                                   (char *)in_stack_fffffffffffff798);
                                QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                                   (char *)in_stack_fffffffffffff798);
                                QDebug::~QDebug(local_4f8);
                                local_190 = (undefined1 *)((ulong)local_190 & 0xffffffffffffff00);
                              }
                              bVar1 = true;
                            }
                            else {
                              local_519 = 0xaa;
                              local_530 = QMetaEnum::fromType<QDBusListener::Setting>();
                              QString::toLatin1((QString *)
                                                CONCAT44(in_stack_fffffffffffff74c,
                                                         in_stack_fffffffffffff748));
                              pbVar4 = (bool *)QByteArray::operator_cast_to_char_
                                                         ((QByteArray *)0xb24b53);
                              s = QMetaEnum::keyToValue((char *)&local_530,pbVar4);
                              QByteArray::~QByteArray((QByteArray *)0xb24b7c);
                              if ((local_519 & 1) == 0) {
                                local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
                                local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
                                lcQpaThemeDBus();
                                anon_unknown.dwarf_1f37634::
                                QLoggingCategoryMacroHolder<(QtMsgType)1>::
                                QLoggingCategoryMacroHolder
                                          ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                                           in_stack_fffffffffffff750,
                                           (QLoggingCategory *)
                                           CONCAT44(in_stack_fffffffffffff74c,
                                                    in_stack_fffffffffffff748));
                                while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                               operator_cast_to_bool
                                                         ((QLoggingCategoryMacroHolder *)&local_1a8)
                                      , bVar1) {
                                  anon_unknown.dwarf_1f37634::
                                  QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                                            ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb24beb);
                                  QMessageLogger::QMessageLogger
                                            ((QMessageLogger *)in_stack_fffffffffffff760,
                                             (char *)CONCAT44(s,in_stack_fffffffffffff758),
                                             (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                             (char *)CONCAT44(in_stack_fffffffffffff74c,
                                                              in_stack_fffffffffffff748),
                                             (char *)0xb24c04);
                                  QMessageLogger::warning();
                                  QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                                     (QString *)
                                                     CONCAT44(s,in_stack_fffffffffffff758));
                                  QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                                     (char *)in_stack_fffffffffffff798);
                                  QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                                     (QString *)
                                                     CONCAT44(s,in_stack_fffffffffffff758));
                                  QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                                     (char *)in_stack_fffffffffffff798);
                                  QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                                     (char *)in_stack_fffffffffffff798);
                                  QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                                     (char *)in_stack_fffffffffffff798);
                                  QDebug::~QDebug(local_550);
                                  local_1a0 = (undefined1 *)((ulong)local_1a0 & 0xffffffffffffff00);
                                }
                                bVar1 = true;
                                in_stack_fffffffffffff75c = s;
                              }
                              else {
                                in_stack_fffffffffffff75c = s;
                                memset(&local_5a0,0,0x30);
                                local_5a0 = &DAT_aaaaaaaaaaaaaaaa;
                                local_598 = &DAT_aaaaaaaaaaaaaaaa;
                                local_590 = &DAT_aaaaaaaaaaaaaaaa;
                                local_588 = &DAT_aaaaaaaaaaaaaaaa;
                                local_580 = &DAT_aaaaaaaaaaaaaaaa;
                                local_578 = &DAT_aaaaaaaaaaaaaaaa;
                                DBusKey::DBusKey(in_stack_fffffffffffff760,
                                                 (QString *)
                                                 CONCAT44(in_stack_fffffffffffff75c,
                                                          in_stack_fffffffffffff758),
                                                 &in_stack_fffffffffffff750->location);
                                bVar1 = QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                                        ::contains((
                                                  QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                                                  *)CONCAT44(in_stack_fffffffffffff75c,
                                                             in_stack_fffffffffffff758),
                                                  in_stack_fffffffffffff750);
                                if (bVar1) {
                                  local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
                                  local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
                                  lcQpaThemeDBus();
                                  anon_unknown.dwarf_1f37634::
                                  QLoggingCategoryMacroHolder<(QtMsgType)1>::
                                  QLoggingCategoryMacroHolder
                                            ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                                             in_stack_fffffffffffff750,
                                             (QLoggingCategory *)
                                             CONCAT44(in_stack_fffffffffffff74c,
                                                      in_stack_fffffffffffff748));
                                  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder
                                                 ::operator_cast_to_bool
                                                           ((QLoggingCategoryMacroHolder *)
                                                            &local_1b8), bVar1) {
                                    anon_unknown.dwarf_1f37634::
                                    QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                                              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb24dc7
                                              );
                                    QMessageLogger::QMessageLogger
                                              ((QMessageLogger *)in_stack_fffffffffffff760,
                                               (char *)CONCAT44(in_stack_fffffffffffff75c,
                                                                in_stack_fffffffffffff758),
                                               (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                               (char *)CONCAT44(in_stack_fffffffffffff74c,
                                                                in_stack_fffffffffffff748),
                                               (char *)0xb24de0);
                                    QMessageLogger::warning();
                                    QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                                       (QString *)
                                                       CONCAT44(in_stack_fffffffffffff75c,
                                                                in_stack_fffffffffffff758));
                                    QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                                       (char *)in_stack_fffffffffffff798);
                                    QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                                       (QString *)
                                                       CONCAT44(in_stack_fffffffffffff75c,
                                                                in_stack_fffffffffffff758));
                                    QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                                       (QString *)
                                                       CONCAT44(in_stack_fffffffffffff75c,
                                                                in_stack_fffffffffffff758));
                                    QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                                       (char *)in_stack_fffffffffffff798);
                                    QDebug::~QDebug(&local_5a8);
                                    local_1b0 = (undefined1 *)
                                                ((ulong)local_1b0 & 0xffffffffffffff00);
                                  }
                                  bVar1 = true;
                                }
                                else {
                                  in_stack_fffffffffffff750 = (DBusKey *)(in_RDI + 0x10);
                                  ChangeSignal::ChangeSignal(local_5d0,p,s);
                                  QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                                  ::insert((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                                            *)in_stack_fffffffffffff760,
                                           (DBusKey *)
                                           CONCAT44(in_stack_fffffffffffff75c,
                                                    in_stack_fffffffffffff758),
                                           (ChangeSignal *)in_stack_fffffffffffff750);
                                  bVar1 = false;
                                }
                                DBusKey::~DBusKey(in_stack_fffffffffffff750);
                              }
                            }
                            QString::~QString((QString *)0xb24ee2);
                            QString::~QString((QString *)0xb24eef);
                            QString::~QString((QString *)0xb24efc);
                            QString::~QString((QString *)0xb24f09);
                          }
                        }
                      }
                    }
                    QJsonObject::~QJsonObject((QJsonObject *)&local_3c0);
                    if (!bVar1) goto LAB_00b24f29;
                  }
                  else {
                    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
                    local_e0 = &DAT_aaaaaaaaaaaaaaaa;
                    lcQpaThemeDBus();
                    anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                    QLoggingCategoryMacroHolder
                              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                               in_stack_fffffffffffff750,
                               (QLoggingCategory *)
                               CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
                    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                   operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_e8),
                          bVar1) {
                      anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb240d8);
                      QMessageLogger::QMessageLogger
                                ((QMessageLogger *)in_stack_fffffffffffff760,
                                 (char *)CONCAT44(in_stack_fffffffffffff75c,
                                                  in_stack_fffffffffffff758),
                                 (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                 (char *)CONCAT44(in_stack_fffffffffffff74c,
                                                  in_stack_fffffffffffff748),(char *)0xb240f1);
                      QMessageLogger::warning();
                      QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                         (QString *)
                                         CONCAT44(in_stack_fffffffffffff75c,
                                                  in_stack_fffffffffffff758));
                      QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                         (char *)in_stack_fffffffffffff798);
                      anon_unknown.dwarf_1f37634::JsonKeys::dbusSignals();
                      t_03.m_data = (char *)in_stack_fffffffffffff778;
                      t_03.m_size = (qsizetype)in_stack_fffffffffffff770;
                      QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,t_03);
                      QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                         (char *)in_stack_fffffffffffff798);
                      QDebug::~QDebug((QDebug *)&local_3c0.key.d.size);
                      local_e0 = (undefined1 *)((ulong)local_e0 & 0xffffffffffffff00);
                    }
                  }
                }
                else {
                  sVar5 = QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                          ::count((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                                   *)0xb24f4c);
                  if (sVar5 < 1) {
                    local_1f0 = &DAT_aaaaaaaaaaaaaaaa;
                    local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
                    lcQpaThemeDBus();
                    anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                    QLoggingCategoryMacroHolder
                              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                               in_stack_fffffffffffff750,
                               (QLoggingCategory *)
                               CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
                    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                   operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_1f0),
                          bVar1) {
                      anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb25070);
                      QMessageLogger::QMessageLogger
                                ((QMessageLogger *)in_stack_fffffffffffff760,
                                 (char *)CONCAT44(in_stack_fffffffffffff75c,
                                                  in_stack_fffffffffffff758),
                                 (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                 (char *)CONCAT44(in_stack_fffffffffffff74c,
                                                  in_stack_fffffffffffff748),(char *)0xb25089);
                      QMessageLogger::warning();
                      QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                         (char *)in_stack_fffffffffffff798);
                      QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                         (QString *)
                                         CONCAT44(in_stack_fffffffffffff75c,
                                                  in_stack_fffffffffffff758));
                      QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                         (char *)in_stack_fffffffffffff798);
                      QDebug::~QDebug(local_600);
                      local_1e8 = (undefined1 *)((ulong)local_1e8 & 0xffffffffffffff00);
                    }
                  }
                  else {
                    local_1e0 = &DAT_aaaaaaaaaaaaaaaa;
                    local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
                    lcQpaThemeDBus();
                    anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)4>::
                    QLoggingCategoryMacroHolder
                              ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)
                               in_stack_fffffffffffff750,
                               (QLoggingCategory *)
                               CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
                    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                   operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_1e0),
                          bVar1) {
                      anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)4>::name
                                ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)0xb24fa9);
                      QMessageLogger::QMessageLogger
                                ((QMessageLogger *)in_stack_fffffffffffff760,
                                 (char *)CONCAT44(in_stack_fffffffffffff75c,
                                                  in_stack_fffffffffffff758),
                                 (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                 (char *)CONCAT44(in_stack_fffffffffffff74c,
                                                  in_stack_fffffffffffff748),(char *)0xb24fc2);
                      QMessageLogger::info();
                      QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                         (char *)in_stack_fffffffffffff798);
                      QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                         (QString *)
                                         CONCAT44(in_stack_fffffffffffff75c,
                                                  in_stack_fffffffffffff758));
                      QDebug::~QDebug(&local_5d8);
                      local_1d8 = (undefined1 *)((ulong)local_1d8 & 0xffffffffffffff00);
                    }
                  }
                }
                goto LAB_00b250f8;
              }
              local_d8 = &DAT_aaaaaaaaaaaaaaaa;
              local_d0 = &DAT_aaaaaaaaaaaaaaaa;
              lcQpaThemeDBus();
              anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
              QLoggingCategoryMacroHolder
                        ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffff750,
                         (QLoggingCategory *)
                         CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
              while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                             operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_d8), bVar1)
              {
                anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                          ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb23f2a);
                QMessageLogger::QMessageLogger
                          ((QMessageLogger *)in_stack_fffffffffffff760,
                           (char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                           (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                           (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                           (char *)0xb23f43);
                QMessageLogger::warning();
                QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                   (QString *)
                                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
                QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                   (char *)in_stack_fffffffffffff798);
                anon_unknown.dwarf_1f37634::JsonKeys::dbusSignals();
                t_02.m_data = (char *)in_stack_fffffffffffff778;
                t_02.m_size = (qsizetype)in_stack_fffffffffffff770;
                QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,t_02);
                QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                   (char *)in_stack_fffffffffffff798);
                QDebug::~QDebug(&local_350);
                local_d0 = (undefined1 *)((ulong)local_d0 & 0xffffffffffffff00);
              }
LAB_00b250f8:
              QJsonArray::~QJsonArray(local_348);
            }
            else {
              local_98 = &DAT_aaaaaaaaaaaaaaaa;
              local_90 = &DAT_aaaaaaaaaaaaaaaa;
              lcQpaThemeDBus();
              anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
              QLoggingCategoryMacroHolder
                        ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffff750,
                         (QLoggingCategory *)
                         CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
              while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                             operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_98), bVar1)
              {
                anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                          ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb23d23);
                QMessageLogger::QMessageLogger
                          ((QMessageLogger *)in_stack_fffffffffffff760,
                           (char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                           (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                           (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                           (char *)0xb23d3c);
                QMessageLogger::warning();
                QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                                   (QString *)
                                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
                QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                   (char *)in_stack_fffffffffffff798);
                anon_unknown.dwarf_1f37634::JsonKeys::dbusSignals();
                t_01.m_data = (char *)in_stack_fffffffffffff778;
                t_01.m_size = (qsizetype)in_stack_fffffffffffff770;
                QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,t_01);
                QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,
                                   (char *)in_stack_fffffffffffff798);
                QDebug::~QDebug(local_320);
                local_90 = (undefined1 *)((ulong)local_90 & 0xffffffffffffff00);
              }
            }
          }
          QJsonObject::~QJsonObject(local_2f0);
        }
      }
      else {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        lcQpaThemeDBus();
        anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffff750,
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748)
                  );
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
          anon_unknown.dwarf_1f37634::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xb23882);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffff760,
                     (char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                     (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                     (char *)0xb2389b);
          QMessageLogger::warning();
          QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
          QJsonParseError::errorString();
          QDebug::operator<<((QDebug *)in_stack_fffffffffffff760,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
          QDebug::operator<<((QDebug *)in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
          QString::~QString((QString *)0xb23913);
          QDebug::~QDebug(&local_288);
          local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
        }
      }
      QJsonDocument::~QJsonDocument((QJsonDocument *)&local_268);
    }
  }
  QFile::~QFile((QFile *)&local_200);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
LAB_00b24f29:
  QJsonArray::const_iterator::operator++((const_iterator *)&local_380);
  in_stack_fffffffffffff778 = pDVar6;
  goto LAB_00b2402a;
}

Assistant:

void QDBusListener::loadJson(const QString &fileName)
{
    Q_ASSERT(!fileName.isEmpty());
#define CHECK(cond, warning)\
    if (!cond) {\
        qCWarning(lcQpaThemeDBus) << fileName << warning << "Falling back to default.";\
        return;\
    }

#define PARSE(var, enumeration, string)\
    enumeration var;\
    {\
        bool success;\
        const int val = QMetaEnum::fromType<enumeration>().keyToValue(string.toLatin1(), &success);\
        CHECK(success, "Parse Error: Invalid value" << string << "for" << #var);\
        var = static_cast<enumeration>(val);\
    }

    QFile file(fileName);
    CHECK(file.exists(), fileName << "doesn't exist.");
    CHECK(file.open(QIODevice::ReadOnly), "could not be opened for reading.");

    QJsonParseError error;
    QJsonDocument doc = QJsonDocument::fromJson(file.readAll(), &error);
    CHECK((error.error == QJsonParseError::NoError), error.errorString());
    CHECK(doc.isObject(), "Parse Error: Expected root object" << JsonKeys::root());

    const QJsonObject &root = doc.object();
    CHECK(root.contains(JsonKeys::root()), "Parse Error: Expectned root object" << JsonKeys::root());
    CHECK(root[JsonKeys::root()][JsonKeys::dbusSignals()].isArray(), "Parse Error: Expected array" << JsonKeys::dbusSignals());

    const QJsonArray &sigs = root[JsonKeys::root()][JsonKeys::dbusSignals()].toArray();
    CHECK((sigs.count() > 0), "Parse Error: Found empty array" << JsonKeys::dbusSignals());

    for (auto sig = sigs.constBegin(); sig != sigs.constEnd(); ++sig) {
        CHECK(sig->isObject(), "Parse Error: Expected object array" << JsonKeys::dbusSignals());
        const QJsonObject &obj = sig->toObject();
        CHECK(obj.contains(JsonKeys::dbusLocation()), "Parse Error: Expected key" << JsonKeys::dbusLocation());
        CHECK(obj.contains(JsonKeys::dbusKey()), "Parse Error: Expected key" << JsonKeys::dbusKey());
        CHECK(obj.contains(JsonKeys::provider()), "Parse Error: Expected key" << JsonKeys::provider());
        CHECK(obj.contains(JsonKeys::setting()), "Parse Error: Expected key" << JsonKeys::setting());
        const QString &location = obj[JsonKeys::dbusLocation()].toString();
        const QString &key = obj[JsonKeys::dbusKey()].toString();
        const QString &providerString = obj[JsonKeys::provider()].toString();
        const QString &settingString = obj[JsonKeys::setting()].toString();
        PARSE(provider, Provider, providerString);
        PARSE(setting, Setting, settingString);
        const DBusKey dkey(location, key);
        CHECK (!m_signalMap.contains(dkey), "Duplicate key" << location << key);
        m_signalMap.insert(dkey, ChangeSignal(provider, setting));
    }
#undef PARSE
#undef CHECK

    if (m_signalMap.count() > 0)
        qCInfo(lcQpaThemeDBus) << "Successfully imported" << fileName;
    else
        qCWarning(lcQpaThemeDBus) << "No data imported from" << fileName << "falling back to default.";

#ifdef QT_DEBUG
    const int count = m_signalMap.count();
    if (count == 0)
        return;

    qCDebug(lcQpaThemeDBus) << "Listening to" << count << "signals:";
    for (auto it = m_signalMap.constBegin(); it != m_signalMap.constEnd(); ++it) {
        qDebug() << it.key().key << it.key().location << "mapped to"
                 << it.value().provider << it.value().setting;
    }

#endif
}